

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O2

word If_Dec6MoveTo(word t,int v,int p,int *Pla2Var,int *Var2Pla)

{
  ulong *puVar1;
  int iVar2;
  
  iVar2 = Var2Pla[v];
  if (iVar2 < p) {
    __assert_fail("Var2Pla[v] >= p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec07.c"
                  ,0xf0,"word If_Dec6MoveTo(word, int, int, int *, int *)");
  }
  while (iVar2 != p) {
    t = If_Dec6SwapAdjacent(t,iVar2 + -1);
    Var2Pla[Pla2Var[(long)iVar2 + -1]] = Var2Pla[Pla2Var[(long)iVar2 + -1]] + 1;
    Var2Pla[Pla2Var[iVar2]] = Var2Pla[Pla2Var[iVar2]] + -1;
    puVar1 = (ulong *)(Pla2Var + (long)iVar2 + -1);
    *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
    iVar2 = Var2Pla[v];
  }
  if (Pla2Var[(uint)p] != v) {
    __assert_fail("Pla2Var[p] == v",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec07.c"
                  ,0xfc,"word If_Dec6MoveTo(word, int, int, int *, int *)");
  }
  return t;
}

Assistant:

static inline word If_Dec6MoveTo( word t, int v, int p, int Pla2Var[6], int Var2Pla[6] )
{
    int iPlace0, iPlace1;
    assert( Var2Pla[v] >= p );
    while ( Var2Pla[v] != p )
    {
        iPlace0 = Var2Pla[v]-1;
        iPlace1 = Var2Pla[v];
        t = If_Dec6SwapAdjacent( t, iPlace0 );
        Var2Pla[Pla2Var[iPlace0]]++;
        Var2Pla[Pla2Var[iPlace1]]--;
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Pla2Var[iPlace1] ^= Pla2Var[iPlace0];
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
    }
    assert( Pla2Var[p] == v );
    return t;
}